

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopScope(cmMakefile *this)

{
  cmFileLockPool::PopFunctionScope(&this->LocalGenerator->GlobalGenerator->FileLockPool);
  PopLoopBlockBarrier(this);
  CheckForUnusedVariables(this);
  std::__cxx11::list<cmDefinitions,_std::allocator<cmDefinitions>_>::pop_back
            (&((this->Internal).x_)->VarStack);
  return;
}

Assistant:

void cmMakefile::PopScope()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PopFunctionScope();
#endif

  this->PopLoopBlockBarrier();

  this->CheckForUnusedVariables();

  this->Internal->PopDefinitions();
}